

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qteamcitylogger.cpp
# Opt level: O0

void __thiscall QTeamCityLogger::QTeamCityLogger(QTeamCityLogger *this,char *filename)

{
  QAbstractTestLogger *in_RDI;
  char *in_stack_ffffffffffffffc8;
  
  QAbstractTestLogger::QAbstractTestLogger(in_RDI,in_stack_ffffffffffffffc8);
  in_RDI->_vptr_QAbstractTestLogger = (_func_int **)&PTR__QTeamCityLogger_001e7078;
  QTestCharBuffer::QTestCharBuffer((QTestCharBuffer *)(in_RDI + 1));
  QTestCharBuffer::QTestCharBuffer((QTestCharBuffer *)(in_RDI + 0x22));
  QTestCharBuffer::QTestCharBuffer((QTestCharBuffer *)(in_RDI + 0x43));
  return;
}

Assistant:

QTeamCityLogger::QTeamCityLogger(const char *filename)
    : QAbstractTestLogger(filename)
{
}